

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall
cs_impl::any::holder<cs_impl::path_cs_ext::path_info>::duplicate
          (holder<cs_impl::path_cs_ext::path_info> *this)

{
  holder<cs_impl::path_cs_ext::path_info> *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<cs_impl::path_cs_ext::path_info>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cs_impl::path_cs_ext::path_info&>
                     ((allocator_type<cs_impl::any::holder<cs_impl::path_cs_ext::path_info>,64ul,cs_impl::default_allocator_provider>
                       *)allocator,&this->mDat);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}